

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_14UL> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          ArrayPtr<const_char> *params_3,CappedArray<char,_26UL> *params_4,
          ArrayPtr<const_char> *params_5,CappedArray<char,_26UL> *params_6)

{
  size_t sVar1;
  CappedArray<char,_14UL> *pCVar2;
  ArrayPtr<const_char> *pAVar3;
  CappedArray<char,_26UL> *pCVar4;
  char *pos;
  CappedArray<char,_14UL> *rest_1;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_4;
  CappedArray<char,_26UL> *rest_5;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  _ *local_128;
  undefined8 local_120;
  Array<kj::StringTree::Branch> local_118;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  _ *local_c8;
  undefined8 local_c0;
  String local_b8;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  _ *local_58;
  undefined8 local_50;
  undefined1 local_41;
  CappedArray<char,_26UL> *local_40;
  CappedArray<char,_26UL> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  CappedArray<char,_14UL> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  CappedArray<char,_14UL> *params_local;
  StringTree *result;
  
  local_41 = 0;
  local_40 = (CappedArray<char,_26UL> *)params_3;
  params_local_4 = (CappedArray<char,_26UL> *)params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (CappedArray<char,_14UL> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_90 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_1);
  local_88 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_2);
  local_80 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_3);
  local_78 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_4);
  local_70 = CappedArray<char,_26UL>::size(local_40);
  local_68 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_4);
  local_60 = CappedArray<char,_26UL>::size((CappedArray<char,_26UL> *)params_5);
  local_58 = (_ *)&local_90;
  local_50 = 7;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x7;
  sVar1 = kj::_::sum(local_58,nums);
  __return_storage_ptr__->size_ = sVar1;
  pCVar2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_1);
  local_100 = flatSize<kj::CappedArray<char,14ul>>(pCVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_f8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_3);
  local_f0 = flatSize<kj::CappedArray<char,14ul>>(pCVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>(local_40);
  local_e0 = flatSize<kj::CappedArray<char,26ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_5);
  local_d0 = flatSize<kj::CappedArray<char,26ul>>(pCVar4);
  local_c8 = (_ *)&local_100;
  local_c0 = 7;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x7;
  sVar1 = kj::_::sum(local_c8,nums_00);
  heapString(&local_b8,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_b8);
  String::~String(&local_b8);
  pCVar2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_1);
  local_160 = branchCount<kj::CappedArray<char,14ul>>(pCVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_158 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_3);
  local_150 = branchCount<kj::CappedArray<char,14ul>>(pCVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  local_148 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>(local_40);
  local_140 = branchCount<kj::CappedArray<char,26ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  local_138 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_5);
  local_130 = branchCount<kj::CappedArray<char,26ul>>(pCVar4);
  local_128 = (_ *)&local_160;
  local_120 = 7;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x7;
  sVar1 = kj::_::sum(local_128,nums_01);
  heapArray<kj::StringTree::Branch>(&local_118,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_118);
  Array<kj::StringTree::Branch>::~Array(&local_118);
  pos = String::begin(&__return_storage_ptr__->text);
  pCVar2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_1);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  rest_1 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_4);
  pCVar4 = fwd<kj::CappedArray<char,26ul>>(local_40);
  rest_4 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_4);
  rest_5 = fwd<kj::CappedArray<char,26ul>>((NoInfer<kj::CappedArray<char,_26UL>_> *)params_5);
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,pos,0,pCVar2,pAVar3,rest_1,rest_2,pCVar4,rest_4,rest_5);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}